

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bytecodeCompiler.c
# Opt level: O2

sysbvm_tuple_t
sysbvm_functionBytecodeAssembler_slotAtPut
          (sysbvm_context_t *context,sysbvm_functionBytecodeAssembler_t *assembler,
          sysbvm_tuple_t tuple,sysbvm_tuple_t typeSlot,sysbvm_tuple_t value)

{
  sysbvm_tuple_t sVar1;
  
  sVar1 = sysbvm_array_create(context,3);
  if ((sVar1 & 0xf) == 0 && sVar1 != 0) {
    *(sysbvm_tuple_t *)(sVar1 + 0x10) = tuple;
    *(sysbvm_tuple_t *)(sVar1 + 0x18) = typeSlot;
    *(sysbvm_tuple_t *)(sVar1 + 0x20) = value;
  }
  sVar1 = sysbvm_functionBytecodeAssemblerInstruction_create(context,'8',sVar1);
  sysbvm_functionBytecodeAssembler_addInstruction(assembler,sVar1);
  return sVar1;
}

Assistant:

SYSBVM_API sysbvm_tuple_t sysbvm_functionBytecodeAssembler_slotAtPut(sysbvm_context_t *context, sysbvm_functionBytecodeAssembler_t *assembler, sysbvm_tuple_t tuple, sysbvm_tuple_t typeSlot, sysbvm_tuple_t value)
{
    sysbvm_tuple_t operands = sysbvm_array_create(context, 3);
    sysbvm_array_atPut(operands, 0, tuple);
    sysbvm_array_atPut(operands, 1, typeSlot);
    sysbvm_array_atPut(operands, 2, value);

    sysbvm_tuple_t instruction = sysbvm_functionBytecodeAssemblerInstruction_create(context, SYSBVM_OPCODE_SLOT_AT_PUT, operands);
    sysbvm_functionBytecodeAssembler_addInstruction(assembler, instruction);
    return instruction;
}